

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O0

int supports_full_hd(char *monitor)

{
  cJSON_bool cVar1;
  cJSON *object;
  char *pcVar2;
  cJSON *pcVar3;
  cJSON *item;
  cJSON *local_58;
  cJSON *height;
  cJSON *width;
  char *error_ptr;
  cJSON *monitor_json;
  int status;
  cJSON *name;
  cJSON *resolutions;
  cJSON *resolution;
  char *monitor_local;
  
  monitor_json._4_4_ = 0;
  object = cJSON_Parse(monitor);
  if (object == (cJSON *)0x0) {
    pcVar2 = cJSON_GetErrorPtr();
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"Error before: %s\n",pcVar2);
    }
    monitor_json._4_4_ = 0;
  }
  else {
    pcVar3 = cJSON_GetObjectItemCaseSensitive(object,"name");
    cVar1 = cJSON_IsString(pcVar3);
    if ((cVar1 != 0) && (pcVar3->valuestring != (char *)0x0)) {
      printf("Checking monitor \"%s\"\n",pcVar3->valuestring);
    }
    pcVar3 = cJSON_GetObjectItemCaseSensitive(object,"resolutions");
    if (pcVar3 == (cJSON *)0x0) {
      local_58 = (cJSON *)0x0;
    }
    else {
      local_58 = pcVar3->child;
    }
    for (resolutions = local_58; resolutions != (cJSON *)0x0; resolutions = resolutions->next) {
      pcVar3 = cJSON_GetObjectItemCaseSensitive(resolutions,"width");
      item = cJSON_GetObjectItemCaseSensitive(resolutions,"height");
      cVar1 = cJSON_IsNumber(pcVar3);
      if ((cVar1 == 0) || (cVar1 = cJSON_IsNumber(item), cVar1 == 0)) {
        monitor_json._4_4_ = 0;
        break;
      }
      cVar1 = compare_double(pcVar3->valuedouble,1920.0);
      if ((cVar1 != 0) && (cVar1 = compare_double(item->valuedouble,1080.0), cVar1 != 0)) {
        monitor_json._4_4_ = 1;
        break;
      }
    }
  }
  cJSON_Delete(object);
  return monitor_json._4_4_;
}

Assistant:

static int supports_full_hd(const char * const monitor)
{
    const cJSON *resolution = NULL;
    const cJSON *resolutions = NULL;
    const cJSON *name = NULL;
    int status = 0;
    cJSON *monitor_json = cJSON_Parse(monitor);
    if (monitor_json == NULL)
    {
        const char *error_ptr = cJSON_GetErrorPtr();
        if (error_ptr != NULL)
        {
            fprintf(stderr, "Error before: %s\n", error_ptr);
        }
        status = 0;
        goto end;
    }

    name = cJSON_GetObjectItemCaseSensitive(monitor_json, "name");
    if (cJSON_IsString(name) && (name->valuestring != NULL))
    {
        printf("Checking monitor \"%s\"\n", name->valuestring);
    }

    resolutions = cJSON_GetObjectItemCaseSensitive(monitor_json, "resolutions");
    cJSON_ArrayForEach(resolution, resolutions)
    {
        cJSON *width = cJSON_GetObjectItemCaseSensitive(resolution, "width");
        cJSON *height = cJSON_GetObjectItemCaseSensitive(resolution, "height");

        if (!cJSON_IsNumber(width) || !cJSON_IsNumber(height))
        {
            status = 0;
            goto end;
        }

        if (compare_double(width->valuedouble, 1920) && compare_double(height->valuedouble, 1080))
        {
            status = 1;
            goto end;
        }
    }

end:
    cJSON_Delete(monitor_json);
    return status;
}